

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(int button,bool repeat)

{
  float *pfVar1;
  float fVar2;
  byte in_SIL;
  int in_EDI;
  float fVar3;
  float fVar4;
  float rate;
  float delay;
  float t;
  ImGuiContext *g;
  bool local_1;
  
  fVar2 = (GImGui->IO).MouseDownDuration[in_EDI];
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    if (((in_SIL & 1) != 0) &&
       (pfVar1 = &(GImGui->IO).KeyRepeatDelay, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
      fVar2 = (GImGui->IO).KeyRepeatRate;
      fVar3 = ImFmod(0.0,1.720907e-39);
      fVar4 = ImFmod(0.0,1.720992e-39);
      if (fVar2 * 0.5 < fVar3 != fVar2 * 0.5 < fVar4) {
        return true;
      }
    }
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        float delay = g.IO.KeyRepeatDelay, rate = g.IO.KeyRepeatRate;
        if ((ImFmod(t - delay, rate) > rate*0.5f) != (ImFmod(t - delay - g.IO.DeltaTime, rate) > rate*0.5f))
            return true;
    }

    return false;
}